

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::internal::ParseInt32Flag(char *str,char *flag,Int32 *value)

{
  bool bVar1;
  char *str_00;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  this;
  size_t sVar2;
  Message local_38;
  
  bVar1 = false;
  str_00 = ParseFlagValue(str,flag,false);
  if (str_00 != (char *)0x0) {
    this.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                operator_new(0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)this.ptr_);
    *(undefined8 *)(this.ptr_ + *(long *)(*(long *)(this.ptr_ + 0x10) + -0x18) + 0x18) = 0x11;
    local_38.ss_.ptr_ =
         (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )this.ptr_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(this.ptr_ + 0x10),"The value of flag --",0x14);
    if (flag == (char *)0x0) {
      flag = "(null)";
      sVar2 = 6;
    }
    else {
      sVar2 = strlen(flag);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(this.ptr_ + 0x10),flag,sVar2);
    bVar1 = ParseInt32(&local_38,str_00,value);
    (**(code **)(*(long *)this.ptr_ + 8))(this.ptr_);
  }
  return bVar1;
}

Assistant:

bool ParseInt32Flag(const char* str, const char* flag, Int32* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(Message() << "The value of flag --" << flag,
                    value_str, value);
}